

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanCommandBuffer::CopyImageToBuffer
          (VulkanCommandBuffer *this,VkImage srcImage,VkImageLayout srcImageLayout,
          VkBuffer dstBuffer,uint32_t regionCount,VkBufferImageCopy *pRegions)

{
  string msg;
  string local_50;
  
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])dstBuffer);
    Diligent::DebugAssertionFailed
              (local_50._M_dataplus._M_p,"CopyImageToBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x228);
    std::__cxx11::string::~string((string *)&local_50);
  }
  EndRenderScope(this);
  FlushBarriers(this);
  (*vkCmdCopyImageToBuffer)
            (this->m_VkCmdBuffer,srcImage,srcImageLayout,dstBuffer,regionCount,pRegions);
  return;
}

Assistant:

__forceinline void CopyImageToBuffer(VkImage                  srcImage,
                                         VkImageLayout            srcImageLayout,
                                         VkBuffer                 dstBuffer,
                                         uint32_t                 regionCount,
                                         const VkBufferImageCopy* pRegions)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        // Copy operations must be performed outside of render pass.
        EndRenderScope();
        FlushBarriers();
        vkCmdCopyImageToBuffer(m_VkCmdBuffer, srcImage, srcImageLayout, dstBuffer, regionCount, pRegions);
    }